

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O0

void __thiscall
flatbuffers::rust::RustGenerator::GenKeyFieldMethods(RustGenerator *this,FieldDef *field)

{
  FieldDef *field_00;
  bool bVar1;
  char *__s;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  string local_70;
  allocator<char> local_39;
  string local_38;
  FieldDef *local_18;
  FieldDef *field_local;
  RustGenerator *this_local;
  
  local_18 = field;
  field_local = (FieldDef *)this;
  if ((field->key & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"KEY_TYPE",&local_39);
    field_00 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"",&local_91);
    GenTableAccessorFuncReturnType(&local_70,this,field_00,&local_90);
    CodeWriter::SetValue(&this->code_,&local_38,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"REF",&local_b9);
    bVar1 = IsString(&(local_18->value).type);
    __s = "&";
    if (bVar1) {
      __s = "";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,__s,&local_e1);
    CodeWriter::SetValue(&this->code_,&local_b8,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"#[inline]",&local_109);
    CodeWriter::operator+=(&this->code_,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,
               "pub fn key_compare_less_than(&self, o: &{{STRUCT_TY}}) -> bool {",&local_131);
    CodeWriter::operator+=(&this->code_,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator(&local_131);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"  self.{{FIELD}}() < o.{{FIELD}}()",&local_159);
    CodeWriter::operator+=(&this->code_,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator(&local_159);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"}",&local_181);
    CodeWriter::operator+=(&this->code_,&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator(&local_181);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"",&local_1a9);
    CodeWriter::operator+=(&this->code_,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator(&local_1a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"#[inline]",&local_1d1);
    CodeWriter::operator+=(&this->code_,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,
               "pub fn key_compare_with_value(&self, val: {{KEY_TYPE}}) -> ::core::cmp::Ordering {",
               &local_1f9);
    CodeWriter::operator+=(&this->code_,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,"  let key = self.{{FIELD}}();",&local_221);
    CodeWriter::operator+=(&this->code_,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator(&local_221);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,"  key.cmp({{REF}}val)",&local_249);
    CodeWriter::operator+=(&this->code_,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator(&local_249);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"}",&local_271);
    CodeWriter::operator+=(&this->code_,&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator(&local_271);
    return;
  }
  __assert_fail("field.key",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_rust.cpp"
                ,0x94e,"void flatbuffers::rust::RustGenerator::GenKeyFieldMethods(const FieldDef &)"
               );
}

Assistant:

void GenKeyFieldMethods(const FieldDef &field) {
    FLATBUFFERS_ASSERT(field.key);

    code_.SetValue("KEY_TYPE", GenTableAccessorFuncReturnType(field, ""));
    code_.SetValue("REF", IsString(field.value.type) ? "" : "&");

    code_ += "#[inline]";
    code_ +=
        "pub fn key_compare_less_than(&self, o: &{{STRUCT_TY}}) -> "
        "bool {";
    code_ += "  self.{{FIELD}}() < o.{{FIELD}}()";
    code_ += "}";
    code_ += "";
    code_ += "#[inline]";
    code_ +=
        "pub fn key_compare_with_value(&self, val: {{KEY_TYPE}}) -> "
        "::core::cmp::Ordering {";
    code_ += "  let key = self.{{FIELD}}();";
    code_ += "  key.cmp({{REF}}val)";
    code_ += "}";
  }